

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O1

unsigned_short protodec_sdlc_crc(uchar *data,uint len)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (len != 0) {
    uVar2 = 0xffff;
    do {
      len = len - 1;
      bVar1 = *data;
      data = data + 1;
      uVar3 = bVar1 | 0x100;
      do {
        uVar5 = uVar2 ^ uVar3;
        uVar4 = (uVar2 & 0xffff) >> 1;
        uVar2 = uVar4 ^ 0xffff8408;
        if ((uVar5 & 1) == 0) {
          uVar2 = uVar4;
        }
        uVar3 = uVar3 >> 1;
      } while (1 < uVar3);
    } while (len != 0);
    return ~(ushort)uVar2;
  }
  return 0;
}

Assistant:

unsigned short protodec_sdlc_crc(const unsigned char *data, unsigned len)
{
	unsigned short c, crc = 0xffff;

	while (len--)
		for (c = 0x100 + *data++; c > 1; c >>= 1)
			if ((crc ^ c) & 1)
				crc = (crc >> 1) ^ 0x8408;
			else
				crc >>= 1;
	return ~crc;

}